

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool __thiscall CConnman::AddedNodesContain(CConnman *this,CAddress *addr)

{
  anon_class_16_2_8d27ffc9_for__M_pred __pred;
  Mutex *pMVar1;
  size_type sVar2;
  const_iterator __first;
  string *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock89;
  string addr_port_str;
  string addr_str;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  char *in_stack_ffffffffffffff48;
  bool local_a9;
  char *in_stack_ffffffffffffff68;
  CService *in_stack_ffffffffffffff70;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffff78;
  CNetAddr *in_stack_ffffffffffffff80;
  undefined1 local_48 [32];
  string local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            (in_stack_ffffffffffffff48,
             (char *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff3c,(Mutex *)0x100a9bf);
  CNetAddr::ToStringAddr_abi_cxx11_(in_stack_ffffffffffffff80);
  CService::ToStringAddrPort_abi_cxx11_(in_stack_ffffffffffffff70);
  pMVar1 = MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
  ;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_ffffffffffffff78,(AnnotatedMixin<std::mutex> *)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68,(char *)in_RDI,(int)((ulong)pMVar1 >> 0x20),
             SUB81((ulong)pMVar1 >> 0x18,0));
  sVar2 = std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>::size
                    ((vector<AddedNodeParams,_std::allocator<AddedNodeParams>_> *)
                     CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  local_a9 = false;
  if (sVar2 < 0x18) {
    std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>::cbegin
              ((vector<AddedNodeParams,_std::allocator<AddedNodeParams>_> *)
               CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    __first = std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>::cend
                        ((vector<AddedNodeParams,_std::allocator<AddedNodeParams>_> *)
                         CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    __pred.addr_port_str = &local_28;
    __pred.addr_str = in_RDI;
    local_a9 = std::
               any_of<__gnu_cxx::__normal_iterator<AddedNodeParams_const*,std::vector<AddedNodeParams,std::allocator<AddedNodeParams>>>,CConnman::AddedNodesContain(CAddress_const&)const::__0>
                         ((__normal_iterator<const_AddedNodeParams_*,_std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>_>
                           )__first._M_current,(AddedNodeParams *)local_48,__pred);
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(local_a9 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CConnman::AddedNodesContain(const CAddress& addr) const
{
    AssertLockNotHeld(m_added_nodes_mutex);
    const std::string addr_str{addr.ToStringAddr()};
    const std::string addr_port_str{addr.ToStringAddrPort()};
    LOCK(m_added_nodes_mutex);
    return (m_added_node_params.size() < 24 // bound the query to a reasonable limit
            && std::any_of(m_added_node_params.cbegin(), m_added_node_params.cend(),
                           [&](const auto& p) { return p.m_added_node == addr_str || p.m_added_node == addr_port_str; }));
}